

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O0

HighsSplitDeque * __thiscall
HighsSplitDeque::WorkerBunk::popSleeper(WorkerBunk *this,HighsSplitDeque *localDeque)

{
  ulong *puVar1;
  pointer pHVar2;
  __pointer_type pHVar3;
  ulong uVar4;
  long in_RDI;
  int newHeadId;
  uint64_t newStackState;
  HighsSplitDeque *newHead;
  HighsSplitDeque *head;
  uint64_t stackState;
  memory_order __b;
  undefined4 in_stack_fffffffffffffe50;
  memory_order in_stack_fffffffffffffe54;
  __pointer_type in_stack_fffffffffffffe58;
  atomic<HighsSplitDeque_*> *in_stack_fffffffffffffe60;
  int local_9c;
  ulong local_68 [4];
  ulong local_48;
  memory_order local_40;
  int local_3c;
  ulong *local_38;
  undefined1 local_29;
  ulong local_28;
  undefined4 local_20;
  undefined4 local_1c;
  ulong local_18;
  ulong *local_10;
  ulong *local_8;
  
  puVar1 = (ulong *)(in_RDI + 0x40);
  local_3c = 0;
  local_38 = puVar1;
  local_40 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_3c - 1U < 2) {
    local_48 = *puVar1;
  }
  else if (local_3c == 5) {
    local_48 = *puVar1;
  }
  else {
    local_48 = *puVar1;
  }
  local_68[0] = local_48;
  uVar4 = local_68[0];
  do {
    local_68[0] = uVar4;
    if ((local_68[0] & 0xfffff) == 0) {
      return (HighsSplitDeque *)0x0;
    }
    pHVar2 = std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>::get
                       ((unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
                         *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    pHVar3 = std::atomic<HighsSplitDeque_*>::load
                       ((atomic<HighsSplitDeque_*> *)in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe54);
    if (pHVar3 == (__pointer_type)0x0) {
      local_9c = 0;
    }
    else {
      local_9c = (pHVar3->workerBunkData).ownerId + 1;
    }
    local_28 = ((local_68[0] >> 0x14) + 1) * 0x100000 | (long)local_9c;
    local_8 = (ulong *)(in_RDI + 0x40);
    local_10 = local_68;
    local_1c = 2;
    local_20 = 0;
    LOCK();
    uVar4 = *local_8;
    local_29 = local_68[0] == uVar4;
    if ((bool)local_29) {
      *local_8 = local_28;
      uVar4 = local_68[0];
    }
    UNLOCK();
    local_18 = local_28;
  } while (!(bool)local_29);
  std::atomic<HighsSplitDeque_*>::store
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
  return pHVar2;
}

Assistant:

HighsSplitDeque* popSleeper(HighsSplitDeque* localDeque) {
      uint64_t stackState = sleeperStack.load(std::memory_order_relaxed);
      HighsSplitDeque* head;
      HighsSplitDeque* newHead;
      uint64_t newStackState;

      do {
        if ((stackState & kIndexMask) == 0) return nullptr;
        head =
            localDeque->ownerData.workers[(stackState & kIndexMask) - 1].get();
        newHead =
            head->workerBunkData.nextSleeper.load(std::memory_order_relaxed);
        int newHeadId =
            newHead != nullptr ? newHead->workerBunkData.ownerId + 1 : 0;
        newStackState = (stackState >> kAbaTagShift) + 1;
        newStackState = (newStackState << kAbaTagShift) | uint64_t(newHeadId);
      } while (!sleeperStack.compare_exchange_weak(stackState, newStackState,
                                                   std::memory_order_acquire,
                                                   std::memory_order_relaxed));

      head->workerBunkData.nextSleeper.store(nullptr,
                                             std::memory_order_relaxed);

      return head;
    }